

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
::swap(btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
       *this,btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
             *x,allocator_type *alloc)

{
  template_ElementType<1UL> tVar1;
  btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  *this_00;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  slot_type *this_01;
  slot_type *__p;
  btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  **ppbVar8;
  btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  **ppbVar9;
  btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  **ppbVar10;
  btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  *pbVar11;
  template_ElementType<1UL> *ptVar12;
  template_ElementType<1UL> *ptVar13;
  allocator_type *alloc_00;
  long lVar14;
  allocator_type *in_R9;
  btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  *this_02;
  size_type i;
  
  bVar2 = leaf(this);
  bVar3 = leaf(x);
  if (bVar2 != bVar3) {
    __assert_fail("leaf() == x->leaf()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x942,
                  "void phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, false>>::swap(btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, false>]"
                 );
  }
  bVar4 = count(this);
  bVar5 = count(x);
  this_02 = x;
  this_00 = this;
  if (bVar5 < bVar4) {
    this_02 = this;
    this_00 = x;
  }
  this_01 = slot(this_00,0);
  __p = slot(this_02,0);
  bVar4 = count(this_00);
  for (lVar14 = (ulong)bVar4 << 6; lVar14 != 0; lVar14 = lVar14 + -0x40) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::swap((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&this_01->value,
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&__p->value);
    this_01 = this_01 + 1;
    __p = __p + 1;
  }
  bVar4 = count(this_02);
  bVar5 = count(this_00);
  bVar6 = count(this_00);
  bVar7 = count(this_00);
  alloc_00 = (allocator_type *)(ulong)bVar7;
  uninitialized_move_n
            (this_02,(ulong)bVar4 - (ulong)bVar5,(ulong)bVar6,(size_type)alloc_00,this_00,in_R9);
  bVar6 = count(this_00);
  value_destroy_n(this_02,(ulong)bVar6,(ulong)bVar4 - (ulong)bVar5,alloc_00);
  bVar2 = leaf(this);
  if (!bVar2) {
    ppbVar8 = mutable_child(this_00,0);
    bVar4 = count(this_00);
    ppbVar9 = mutable_child(this_00,(ulong)bVar4 + 1);
    ppbVar10 = mutable_child(this_02,0);
    for (; ppbVar8 != ppbVar9; ppbVar8 = ppbVar8 + 1) {
      pbVar11 = *ppbVar8;
      *ppbVar8 = *ppbVar10;
      *ppbVar10 = pbVar11;
      ppbVar10 = ppbVar10 + 1;
    }
    for (i = 0; bVar4 = count(this_00), i <= bVar4; i = i + 1) {
      pbVar11 = child(this_00,i);
      set_parent(pbVar11,this_00);
      pbVar11 = child(this_02,i);
      set_parent(pbVar11,this_02);
    }
    for (; bVar4 = count(this_02), i <= bVar4; i = i + 1) {
      pbVar11 = child(this_02,i);
      init_child(this_00,(int)i,pbVar11);
      mutable_child(this_02,i);
    }
  }
  ptVar12 = btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
            ::GetField<1ul>((btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
                             *)this);
  ptVar13 = btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
            ::GetField<1ul>((btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
                             *)x);
  tVar1 = ptVar12[2];
  ptVar12[2] = ptVar13[2];
  ptVar13[2] = tVar1;
  return;
}

Assistant:

void btree_node<P>::swap(btree_node *x, allocator_type *alloc) {
        using std::swap;
        assert(leaf() == x->leaf());

        // Determine which is the smaller/larger node.
        btree_node *smaller = this, *larger = x;
        if (smaller->count() > larger->count()) {
            swap(smaller, larger);
        }

        // Swap the values.
        for (slot_type *a = smaller->slot(0), *b = larger->slot(0),
                 *end = a + smaller->count();
             a != end; ++a, ++b) {
            params_type::swap(alloc, a, b);
        }

        // Move values that can't be swapped.
        const size_type to_move = larger->count() - smaller->count();
        larger->uninitialized_move_n(to_move, smaller->count(), smaller->count(),
                                     smaller, alloc);
        larger->value_destroy_n(smaller->count(), to_move, alloc);

        if (!leaf()) {
            // Swap the child pointers.
            std::swap_ranges(&smaller->mutable_child(0),
                             &smaller->mutable_child(smaller->count() + 1),
                             &larger->mutable_child(0));
            // Update swapped children's parent pointers.
            int i = 0;
            for (; i <= smaller->count(); ++i) {
                smaller->child(i)->set_parent(smaller);
                larger->child(i)->set_parent(larger);
            }
            // Move the child pointers that couldn't be swapped.
            for (; i <= larger->count(); ++i) {
                smaller->init_child(i, larger->child(i));
                larger->clear_child(i);
            }
        }

        // Swap the counts.
        swap(mutable_count(), x->mutable_count());
    }